

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void ucnv_getSubstChars_63(UConverter *converter,char *mySubChar,int8_t *len,UErrorCode *err)

{
  char cVar1;
  
  if (U_ZERO_ERROR < *err) {
    return;
  }
  cVar1 = converter->subCharLen;
  if ((long)cVar1 < 1) {
    *len = '\0';
  }
  else if (*len < cVar1) {
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    memcpy(mySubChar,converter->subChars,(long)cVar1);
    *len = converter->subCharLen;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }